

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O1

bool aux_positioning_horizontal(Board *board,int row,int col,Ship ship)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  if (ship.orientation == 'H') {
    if (ship.direction == -1) {
      iVar2 = col - ship.length;
      bVar4 = false;
      uVar5 = row - 1;
      do {
        if (iVar2 <= col + 1) {
          uVar7 = (ulong)(col + 2);
          bVar1 = col + 1 < iVar2;
          do {
            uVar6 = (int)uVar7 - 1;
            uVar7 = (ulong)uVar6;
            if ((((-1 < (int)uVar5) && (-1 < (int)uVar6)) && ((int)uVar5 < board->row)) &&
               (((int)uVar6 < board->column &&
                (iVar3 = std::__cxx11::string::compare
                                   ((char *)(uVar7 * 0x20 +
                                            *(long *)&(board->matrix).
                                                                                                            
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar5].
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data)), iVar3 != 0))))
            {
              if (!bVar1) goto LAB_00102cd2;
              break;
            }
            bVar1 = (int)uVar6 <= iVar2;
          } while (iVar2 < (int)uVar6);
        }
        bVar4 = row < (int)uVar5;
        bVar1 = (int)uVar5 <= row;
        uVar5 = uVar5 + 1;
      } while (bVar1);
    }
    else if (ship.direction == 1) {
      bVar4 = false;
      uVar5 = row - 1;
      do {
        if (-2 < ship.length) {
          uVar7 = (ulong)(col - 2);
          bVar1 = ship.length < -1;
          do {
            uVar6 = (int)uVar7 + 1;
            uVar7 = (ulong)uVar6;
            if (((-1 < (int)uVar5) && (-1 < (int)uVar6)) &&
               (((int)uVar5 < board->row &&
                (((int)uVar6 < board->column &&
                 (iVar2 = std::__cxx11::string::compare
                                    ((char *)(uVar7 * 0x20 +
                                             *(long *)&(board->matrix).
                                                                                                              
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar5].
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data)), iVar2 != 0))))
               )) {
              if (!bVar1) {
LAB_00102cd2:
                if (bVar4) {
                  return true;
                }
                return false;
              }
              break;
            }
            bVar1 = ship.length + col <= (int)uVar6;
          } while ((int)uVar6 < ship.length + col);
        }
        bVar4 = row < (int)uVar5;
        bVar1 = (int)uVar5 <= row;
        uVar5 = uVar5 + 1;
      } while (bVar1);
    }
  }
  return true;
}

Assistant:

bool aux_positioning_horizontal( Board *board, int row, int col, Ship ship )
{
    if( ship.orientation == 'H' )
    {
        if( ship.direction == 1 )
        {
            for( int i = row - 1; i <= row + 1; i++ )
            {
                for( int j = col - 1; j <= col + ship.length; j++ )
                {

                    if( i < 0 or i > board->row - 1 or j < 0 or j > board->column - 1 )
                    {
                        continue;
                    }

                    if( board->matrix[i][j] != "~" )
                    {
                        return false;
                    }
                }
            }
        }
        else if( ship.direction == -1 )
        {
            for( int i = row - 1; i <= row + 1; i++ )
            {
                for( int j = col + 1; j >= col - ship.length; j-- )
                {
                  if( i < 0 or i > board->row - 1 or j < 0 or j > board->column - 1 )
                  {
                      continue;
                  }

                  if( board->matrix[i][j] != "~" )
                  {
                      return false;
                  }
                }
            }
        }
    }

    return true;
}